

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O1

BoxList * __thiscall amrex::BoxList::shiftHalf(BoxList *this,IntVect *iv)

{
  int *piVar1;
  uint uVar2;
  pointer pBVar3;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  Box *bx;
  pointer pBVar4;
  int i;
  long lVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  
  __range1 = &this->m_lbox;
  pBVar3 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar4 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar4 != pBVar3; pBVar4 = pBVar4 + 1) {
    lVar5 = 0;
    do {
      uVar2 = iv->vect[lVar5];
      uVar7 = (pBVar4->btype).itype;
      uVar6 = uVar2 & 1;
      if (uVar6 != 0) {
        (pBVar4->btype).itype = uVar7 ^ 1 << ((uint)lVar5 & 0x1f);
      }
      if ((uVar7 >> ((uint)lVar5 & 0x1f) & 1) == 0) {
        uVar7 = uVar6;
        uVar6 = 0;
      }
      else {
        uVar7 = 0;
      }
      uVar6 = -uVar6;
      if (-1 < (int)uVar2) {
        uVar6 = uVar7;
      }
      iVar8 = uVar6 + (int)uVar2 / 2;
      piVar1 = (pBVar4->smallend).vect + lVar5;
      *piVar1 = *piVar1 + iVar8;
      piVar1 = (pBVar4->bigend).vect + lVar5;
      *piVar1 = *piVar1 + iVar8;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  return (BoxList *)__range1;
}

Assistant:

BoxList&
BoxList::shiftHalf (const IntVect& iv)
{
    for (auto& bx : m_lbox)
    {
        bx.shiftHalf(iv);
    }
    return *this;
}